

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O0

bool __thiscall
libtorrent::udp_tracker_connection::on_connect_response
          (udp_tracker_connection *this,span<const_char> buf)

{
  index_type iVar1;
  session_settings *this_00;
  tracker_request *ptVar2;
  span<const_char> sVar3;
  int local_a4;
  duration<long,_std::ratio<1L,_1L>_> local_a0;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_98;
  duration local_90;
  address local_78;
  mapped_type *local_58;
  connection_cache_entry *cce;
  lock_guard<std::mutex> l;
  int64_t connection_id;
  char *pcStack_38;
  udp_tracker_connection *this_local;
  span<const_char> buf_local;
  bool local_9;
  
  buf_local.m_ptr = (char *)buf.m_len;
  this_local = (udp_tracker_connection *)buf.m_ptr;
  iVar1 = span<const_char>::size((span<const_char> *)&this_local);
  if (iVar1 < 0x10) {
    local_9 = false;
  }
  else {
    timeout_handler::restart_read_timeout((timeout_handler *)this);
    sVar3 = span<const_char>::subspan((span<const_char> *)&this_local,8);
    connection_id = (int64_t)sVar3.m_ptr;
    pcStack_38 = (char *)sVar3.m_len;
    this_local = (udp_tracker_connection *)connection_id;
    buf_local.m_ptr = pcStack_38;
    update_transaction_id(this);
    l._M_device = (mutex_type *)
                  libtorrent::aux::read_int64<char_const>((span<const_char> *)&this_local);
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)&cce,(mutex_type *)m_cache_mutex);
    boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::address(&local_78,&this->m_target);
    local_58 = std::
               map<boost::asio::ip::address,_libtorrent::udp_tracker_connection::connection_cache_entry,_std::less<boost::asio::ip::address>,_std::allocator<std::pair<const_boost::asio::ip::address,_libtorrent::udp_tracker_connection::connection_cache_entry>_>_>
               ::operator[]((map<boost::asio::ip::address,_libtorrent::udp_tracker_connection::connection_cache_entry,_std::less<boost::asio::ip::address>,_std::allocator<std::pair<const_boost::asio::ip::address,_libtorrent::udp_tracker_connection::connection_cache_entry>_>_>
                             *)m_connection_cache,&local_78);
    local_58->connection_id = (int64_t)l._M_device;
    local_98.__d.__r = (duration)libtorrent::aux::time_now();
    this_00 = tracker_manager::settings((this->super_tracker_connection).m_man);
    local_a4 = libtorrent::aux::session_settings::get_int(this_00,0x4045);
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1l>> *)&local_a0,&local_a4);
    local_90.__r = (rep)std::chrono::operator+(&local_98,&local_a0);
    (local_58->expires).__d.__r = local_90.__r;
    ptVar2 = tracker_connection::tracker_req(&this->super_tracker_connection);
    if ((ptVar2->kind & 1) == 0) {
      send_udp_announce(this);
    }
    else {
      ptVar2 = tracker_connection::tracker_req(&this->super_tracker_connection);
      if ((ptVar2->kind & 1) != 0) {
        send_udp_scrape(this);
      }
    }
    local_9 = true;
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&cce);
  }
  return local_9;
}

Assistant:

bool udp_tracker_connection::on_connect_response(span<char const> buf)
	{
		// ignore packets smaller than 16 bytes
		if (buf.size() < 16) return false;

		restart_read_timeout();

		// skip header
		buf = buf.subspan(8);

		// reset transaction
		update_transaction_id();
		std::int64_t const connection_id = aux::read_int64(buf);

		std::lock_guard<std::mutex> l(m_cache_mutex);
		connection_cache_entry& cce = m_connection_cache[m_target.address()];
		cce.connection_id = connection_id;
		cce.expires = aux::time_now() + seconds(m_man.settings().get_int(settings_pack::udp_tracker_token_expiry));

		if (0 == (tracker_req().kind & tracker_request::scrape_request))
			send_udp_announce();
		else if (0 != (tracker_req().kind & tracker_request::scrape_request))
			send_udp_scrape();
		return true;
	}